

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::FindNextProperty
          (SimpleTypeHandler<2UL> *this,ScriptContext *scriptContext,PropertyIndex *index,
          JavascriptString **propertyStringName,PropertyId *propertyId,
          PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
          EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  byte attributes_00;
  PropertyRecord *this_00;
  code *pcVar1;
  bool bVar2;
  EnumeratorFlags EVar3;
  PropertyId PVar4;
  undefined4 *puVar5;
  PropertyRecord **ppPVar6;
  PropertyString *this_01;
  PolymorphicInlineCache *polymorphicInlineCache;
  PropertyString *propStr;
  PropertyRecord *propertyRecord;
  PropertyAttributes attribs;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  JavascriptString **propertyStringName_local;
  PropertyIndex *index_local;
  ScriptContext *scriptContext_local;
  SimpleTypeHandler<2UL> *this_local;
  
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x138,"(propertyStringName)","propertyStringName");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x139,"(propertyId)","propertyId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x13a,"(type)","type");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  do {
    if (this->propertyCount <= (int)(uint)*index) {
      PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
      return 0;
    }
    attributes_00 = this->descriptors[*index].field_1.Attributes;
    if ((attributes_00 & 8) == 0) {
      EVar3 = Js::operator&(flags,EnumNonEnumerable);
      bVar2 = operator!(EVar3);
      if ((!bVar2) || ((attributes_00 & 1) != 0)) {
        ppPVar6 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                            ((WriteBarrierPtr *)(this->descriptors + *index));
        this_00 = *ppPVar6;
        EVar3 = Js::operator&(flags,EnumSymbols);
        bVar2 = operator!(EVar3);
        if ((!bVar2) || (bVar2 = PropertyRecord::IsSymbol(this_00), !bVar2)) {
          if (attributes != (PropertyAttributes *)0x0) {
            *attributes = attributes_00;
          }
          PVar4 = PropertyRecord::GetPropertyId(this_00);
          *propertyId = PVar4;
          this_01 = ScriptContext::GetPropertyString(scriptContext,*propertyId);
          *propertyStringName = &this_01->super_JavascriptString;
          polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_01);
          PropertyValueInfo::SetCacheInfo<Js::PropertyString>
                    (info,this_01,polymorphicInlineCache,false);
          if (((attributes_00 & 4) == 4) && ((DynamicType *)type == typeToEnumerate)) {
            PropertyValueInfo::Set
                      (info,&instance->super_RecyclableObject,*index,attributes_00,
                       InlineCacheNoFlags);
          }
          else {
            PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
          }
          return 1;
        }
      }
    }
    *index = *index + 1;
  } while( true );
}

Assistant:

BOOL SimpleTypeHandler<size>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);

        for( ; index < propertyCount; ++index )
        {
            PropertyAttributes attribs = descriptors[index].Attributes;
            if( !(attribs & PropertyDeleted) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (attribs & PropertyEnumerable)))
            {
                const PropertyRecord* propertyRecord = descriptors[index].Id;

                // Skip this property if it is a symbol and we are not including symbol properties
                if (!(flags & EnumeratorFlags::EnumSymbols) && propertyRecord->IsSymbol())
                {
                    continue;
                }

                if (attributes != nullptr)
                {
                    *attributes = attribs;
                }

                *propertyId = propertyRecord->GetPropertyId();
                PropertyString * propStr = scriptContext->GetPropertyString(*propertyId);
                *propertyStringName = propStr;

                PropertyValueInfo::SetCacheInfo(info, propStr, propStr->GetLdElemInlineCache(), false);
                if ((attribs & PropertyWritable) == PropertyWritable && type == typeToEnumerate)
                {
                    PropertyValueInfo::Set(info, instance, index, attribs);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }